

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_util.c
# Opt level: O0

size_t bitset_extract_setbits_avx512_uint16
                 (uint64_t *array,size_t length,uint16_t *vout,size_t capacity,uint16_t base)

{
  int iVar1;
  undefined1 (*pauVar2) [64];
  long in_RCX;
  undefined1 (*in_RDX) [64];
  ulong in_RSI;
  long in_RDI;
  ushort in_R8W;
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  uint32_t val;
  int r;
  uint64_t w;
  __m512i r2;
  __m512i r1;
  __m512i vbase;
  uint8_t advance;
  __m512i vec;
  uint64_t v;
  size_t i;
  __m512i index_table;
  __m512i base_v;
  uint16_t *safeout;
  uint16_t *initout;
  uint16_t *out;
  short local_cd0;
  unsigned_long_long local_cc8;
  undefined1 local_cc0 [64];
  undefined1 local_c80 [64];
  undefined1 local_c40 [64];
  undefined1 local_c00 [64];
  undefined1 local_bc0 [64];
  undefined1 local_b80 [64];
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined1 local_b00 [64];
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined1 local_a80 [64];
  undefined1 local_a40 [64];
  undefined1 local_a00 [64];
  undefined1 local_9c0 [64];
  byte local_941;
  undefined1 local_940 [64];
  undefined1 local_900 [64];
  uint64_t local_890;
  ulong local_888;
  undefined1 local_880 [64];
  undefined1 local_840 [64];
  undefined1 (*local_7c8) [64];
  undefined1 (*local_7c0) [64];
  undefined1 (*local_7b8) [64];
  ushort local_7aa;
  ulong local_798;
  long local_790;
  uint8_t *local_788;
  undefined1 local_780 [64];
  undefined1 local_740 [64];
  uint64_t local_6c8;
  undefined1 local_6c0 [64];
  undefined1 local_680 [64];
  undefined1 (*local_608) [64];
  undefined1 local_600 [64];
  undefined1 local_5c0 [64];
  undefined1 (*local_548) [64];
  undefined1 local_540 [64];
  ushort local_4c2;
  undefined1 local_4c0 [64];
  undefined1 local_440 [64];
  undefined1 local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  undefined1 local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined1 local_180 [64];
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [64];
  
  local_7c8 = (undefined1 (*) [64])(*in_RDX + in_RCX * 2);
  auVar3 = vpbroadcastw_avx512bw(ZEXT216(in_R8W));
  local_4c0 = vmovdqa64_avx512f(auVar3);
  auVar3 = vmovdqa64_avx512f(local_4c0);
  local_840 = vmovdqa64_avx512f(auVar3);
  local_788 = "";
  auVar3 = vmovdqu64_avx512f((undefined1  [64])vbmi2_table);
  local_880 = vmovdqa64_avx512f(auVar3);
  local_7c0 = in_RDX;
  local_7b8 = in_RDX;
  local_7aa = in_R8W;
  local_798 = in_RSI;
  local_790 = in_RDI;
  for (local_888 = 0; local_888 < local_798 && local_7b8 + 2 < local_7c8; local_888 = local_888 + 1)
  {
    local_890 = *(uint64_t *)(local_790 + local_888 * 8);
    auVar3 = vmovdqa64_avx512f(local_880);
    local_940 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(local_940);
    local_780 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(local_780);
    local_740 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(local_740);
    local_c0 = vmovdqa64_avx512f(ZEXT1664(ZEXT816(0) << 0x40));
    vmovdqa64_avx512f(local_c0);
    auVar3 = vpcompressb_avx512_vbmi2(auVar3,local_890);
    local_900 = vmovdqa64_avx512f(auVar3);
    local_6c8 = local_890;
    iVar1 = roaring_hamming(local_890);
    local_941 = (byte)iVar1;
    auVar3 = vmovdqa64_avx512f(local_840);
    local_4c2 = (ushort)((int)local_888 << 6);
    auVar4 = vpbroadcastw_avx512bw(ZEXT216(local_4c2));
    local_540 = vmovdqa64_avx512f(auVar4);
    auVar4 = vmovdqa64_avx512f(local_540);
    local_a00 = vmovdqa64_avx512f(auVar3);
    local_a40 = vmovdqa64_avx512f(auVar4);
    auVar3 = vmovdqa64_avx512f(local_a40);
    local_200 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(local_a00);
    local_240 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(local_240);
    auVar4 = vmovdqa64_avx512f(local_200);
    local_180 = vmovdqa64_avx512f(auVar3);
    local_1c0 = vmovdqa64_avx512f(auVar4);
    auVar3 = vmovdqa64_avx512f(local_180);
    auVar4 = vmovdqa64_avx512f(local_1c0);
    auVar3 = vpaddw_avx512bw(auVar3,auVar4);
    local_9c0 = vmovdqa64_avx512f(auVar3);
    local_aa0 = local_900._0_8_;
    uStack_a98 = local_900._8_8_;
    uStack_a90 = local_900._16_8_;
    uStack_a88 = local_900._24_8_;
    local_100 = local_900._0_8_;
    uStack_f8 = local_900._8_8_;
    uStack_f0 = local_900._16_8_;
    uStack_e8 = local_900._24_8_;
    local_e0 = local_900._0_8_;
    uStack_d8 = local_900._8_8_;
    uStack_d0 = local_900._16_8_;
    uStack_c8 = local_900._24_8_;
    auVar3 = vpmovsxbw_avx512bw(local_900._0_32_);
    local_a80 = vmovdqa64_avx512f(auVar3);
    local_b20 = local_900._32_8_;
    uStack_b18 = local_900._40_8_;
    uStack_b10 = local_900._48_8_;
    uStack_b08 = local_900._56_8_;
    local_140 = local_900._32_8_;
    uStack_138 = local_900._40_8_;
    uStack_130 = local_900._48_8_;
    uStack_128 = local_900._56_8_;
    local_120 = local_900._32_8_;
    uStack_118 = local_900._40_8_;
    uStack_110 = local_900._48_8_;
    uStack_108 = local_900._56_8_;
    auVar3 = vpmovsxbw_avx512bw(local_900._32_32_);
    local_b00 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(local_a80);
    auVar4 = vmovdqa64_avx512f(local_9c0);
    local_b80 = vmovdqa64_avx512f(auVar3);
    local_bc0 = vmovdqa64_avx512f(auVar4);
    memcpy(local_300,local_bc0,0x40);
    memcpy(local_340,local_b80,0x40);
    auVar3 = vmovdqa64_avx512f(local_340);
    auVar4 = vmovdqa64_avx512f(local_300);
    local_280 = vmovdqa64_avx512f(auVar3);
    local_2c0 = vmovdqa64_avx512f(auVar4);
    auVar3 = vmovdqa64_avx512f(local_280);
    auVar4 = vmovdqa64_avx512f(local_2c0);
    auVar3 = vpaddw_avx512bw(auVar3,auVar4);
    local_a80 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(local_b00);
    auVar4 = vmovdqa64_avx512f(local_9c0);
    local_c00 = vmovdqa64_avx512f(auVar3);
    local_c40 = vmovdqa64_avx512f(auVar4);
    memcpy(local_400,local_c40,0x40);
    memcpy(local_440,local_c00,0x40);
    pauVar2 = local_7b8;
    auVar3 = vmovdqa64_avx512f(local_440);
    auVar4 = vmovdqa64_avx512f(local_400);
    local_380 = vmovdqa64_avx512f(auVar3);
    local_3c0 = vmovdqa64_avx512f(auVar4);
    auVar3 = vmovdqa64_avx512f(local_380);
    auVar4 = vmovdqa64_avx512f(local_3c0);
    auVar3 = vpaddw_avx512bw(auVar3,auVar4);
    local_b00 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(local_a80);
    local_c80 = vmovdqa64_avx512f(auVar3);
    memcpy(local_600,local_c80,0x40);
    auVar3 = vmovdqa64_avx512f(local_600);
    local_548 = pauVar2;
    local_5c0 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(local_5c0);
    auVar3 = vmovdqu64_avx512f(auVar3);
    *pauVar2 = auVar3;
    pauVar2 = local_7b8 + 1;
    auVar3 = vmovdqa64_avx512f(local_b00);
    local_cc0 = vmovdqa64_avx512f(auVar3);
    memcpy(local_6c0,local_cc0,0x40);
    auVar3 = vmovdqa64_avx512f(local_6c0);
    local_680 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(local_680);
    auVar3 = vmovdqu64_avx512f(auVar3);
    *pauVar2 = auVar3;
    local_7b8 = (undefined1 (*) [64])(*local_7b8 + (long)(int)(uint)local_941 * 2);
    local_608 = pauVar2;
  }
  local_7aa = local_7aa + (short)local_888 * 0x40;
  for (; local_888 < local_798 && local_7b8 < local_7c8; local_888 = local_888 + 1) {
    for (local_cc8 = *(unsigned_long_long *)(local_790 + local_888 * 8);
        local_cc8 != 0 && local_7b8 < local_7c8; local_cc8 = local_cc8 - 1 & local_cc8) {
      iVar1 = roaring_trailing_zeroes(local_cc8);
      local_cd0 = (short)iVar1 + local_7aa;
      *(short *)*local_7b8 = local_cd0;
      local_7b8 = (undefined1 (*) [64])(*local_7b8 + 2);
    }
    local_7aa = local_7aa + 0x40;
  }
  return (long)local_7b8 - (long)local_7c0 >> 1;
}

Assistant:

size_t bitset_extract_setbits_avx512_uint16(const uint64_t *array,
                                            size_t length, uint16_t *vout,
                                            size_t capacity, uint16_t base) {
    uint16_t *out = (uint16_t *)vout;
    uint16_t *initout = out;
    uint16_t *safeout = vout + capacity;

    __m512i base_v = _mm512_set1_epi16(base);
    __m512i index_table = _mm512_loadu_si512(vbmi2_table);
    size_t i = 0;

    for (; (i < length) && ((out + 64) < safeout); i++) {
        uint64_t v = array[i];
        __m512i vec = _mm512_maskz_compress_epi8(v, index_table);

        uint8_t advance = (uint8_t)roaring_hamming(v);

        __m512i vbase =
            _mm512_add_epi16(base_v, _mm512_set1_epi16((short)(i * 64)));
        __m512i r1 = _mm512_cvtepi8_epi16(_mm512_extracti32x8_epi32(vec, 0));
        __m512i r2 = _mm512_cvtepi8_epi16(_mm512_extracti32x8_epi32(vec, 1));

        r1 = _mm512_add_epi16(r1, vbase);
        r2 = _mm512_add_epi16(r2, vbase);

        _mm512_storeu_si512((__m512i *)out, r1);
        _mm512_storeu_si512((__m512i *)(out + 32), r2);
        out += advance;
    }

    base += i * 64;

    for (; (i < length) && (out < safeout); ++i) {
        uint64_t w = array[i];
        while ((w != 0) && (out < safeout)) {
            int r =
                roaring_trailing_zeroes(w);  // on x64, should compile to TZCNT
            uint32_t val = r + base;
            memcpy(out, &val, sizeof(uint16_t));
            out++;
            w &= (w - 1);
        }
        base += 64;
    }

    return out - initout;
}